

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSRuntime * JS_NewRuntime2(JSMallocFunctions *mf,void *opaque)

{
  JSClass *pJVar1;
  _func_void_ptr_JSMallocState_ptr_size_t *p_Var2;
  _func_void_JSMallocState_ptr_void_ptr *p_Var3;
  _func_size_t_void_ptr *p_Var4;
  int iVar5;
  JSAtom JVar6;
  JSRuntime *rt;
  size_t sVar7;
  JSShape **ppJVar8;
  uint uVar9;
  char *__s;
  undefined1 auStack_40008 [262064];
  JSMallocState local_58;
  JSMallocState *local_38;
  
  local_58.malloc_count = 0;
  local_58.malloc_size = 0;
  local_58.malloc_limit = 0xffffffffffffffff;
  local_58.opaque = opaque;
  rt = (JSRuntime *)(*mf->js_malloc)(&local_58,400);
  if (rt != (JSRuntime *)0x0) {
    memset(rt,0,400);
    p_Var2 = mf->js_malloc;
    p_Var3 = mf->js_free;
    p_Var4 = mf->js_malloc_usable_size;
    (rt->mf).js_realloc = mf->js_realloc;
    (rt->mf).js_malloc_usable_size = p_Var4;
    (rt->mf).js_malloc = p_Var2;
    (rt->mf).js_free = p_Var3;
    if ((rt->mf).js_malloc_usable_size == (_func_size_t_void_ptr *)0x0) {
      (rt->mf).js_malloc_usable_size = js_malloc_usable_size_unknown;
    }
    (rt->malloc_state).malloc_limit = local_58.malloc_limit;
    (rt->malloc_state).opaque = local_58.opaque;
    (rt->malloc_state).malloc_count = local_58.malloc_count;
    (rt->malloc_state).malloc_size = local_58.malloc_size;
    rt->malloc_gc_threshold = 0x40000;
    (rt->context_list).prev = &rt->context_list;
    (rt->context_list).next = &rt->context_list;
    (rt->gc_obj_list).prev = &rt->gc_obj_list;
    (rt->gc_obj_list).next = &rt->gc_obj_list;
    (rt->gc_zero_ref_count_list).prev = &rt->gc_zero_ref_count_list;
    (rt->gc_zero_ref_count_list).next = &rt->gc_zero_ref_count_list;
    rt->field_0xb8 = 0;
    (rt->job_list).prev = &rt->job_list;
    (rt->job_list).next = &rt->job_list;
    rt->atom_hash_size = 0;
    rt->atom_hash = (uint32_t *)0x0;
    rt->atom_count = 0;
    rt->atom_size = 0;
    rt->atom_free_index = 0;
    iVar5 = JS_ResizeAtomHash(rt,0x100);
    if (iVar5 == 0) {
      local_38 = &rt->malloc_state;
      uVar9 = 1;
      __s = "null";
      do {
        iVar5 = (0xc4 < uVar9) + 1 + (uint)(0xc4 < uVar9);
        if (uVar9 == 0xc4) {
          iVar5 = 4;
        }
        sVar7 = strlen(__s);
        JVar6 = __JS_NewAtomInit(rt,__s,(int)sVar7,iVar5);
        if (JVar6 == 0) goto LAB_00116502;
        __s = __s + (long)(int)sVar7 + 1;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0xd2);
      iVar5 = init_class_range(rt,js_std_class_def,1,0x28);
      if (-1 < iVar5) {
        pJVar1 = rt->class_array;
        pJVar1[8].exotic = &js_arguments_exotic_methods;
        pJVar1[5].exotic = &js_string_exotic_methods;
        pJVar1[0xb].exotic = &js_module_ns_exotic_methods;
        pJVar1[0xc].call = js_call_c_function;
        pJVar1[0xf].call = js_c_function_data_call;
        pJVar1[0xe].call = js_call_bound_function;
        pJVar1[0x10].call = js_generator_function_call;
        rt->shape_hash_bits = 4;
        rt->shape_hash_size = 0x10;
        rt->shape_hash_count = 0;
        ppJVar8 = (JSShape **)(*(rt->mf).js_malloc)(local_38,0x80);
        if (ppJVar8 != (JSShape **)0x0) {
          ppJVar8[0xe] = (JSShape *)0x0;
          ppJVar8[0xf] = (JSShape *)0x0;
          ppJVar8[0xc] = (JSShape *)0x0;
          ppJVar8[0xd] = (JSShape *)0x0;
          ppJVar8[10] = (JSShape *)0x0;
          ppJVar8[0xb] = (JSShape *)0x0;
          ppJVar8[8] = (JSShape *)0x0;
          ppJVar8[9] = (JSShape *)0x0;
          ppJVar8[6] = (JSShape *)0x0;
          ppJVar8[7] = (JSShape *)0x0;
          ppJVar8[4] = (JSShape *)0x0;
          ppJVar8[5] = (JSShape *)0x0;
          ppJVar8[2] = (JSShape *)0x0;
          ppJVar8[3] = (JSShape *)0x0;
          *ppJVar8 = (JSShape *)0x0;
          ppJVar8[1] = (JSShape *)0x0;
          rt->shape_hash = ppJVar8;
          rt->stack_size = 0x40000;
          rt->stack_top = (uintptr_t)&stack0xfffffffffffffff8;
          rt->stack_limit = (uintptr_t)auStack_40008;
          (rt->current_exception).u.int32 = 0;
          (rt->current_exception).tag = 2;
          return rt;
        }
        rt->shape_hash = (JSShape **)0x0;
      }
    }
LAB_00116502:
    JS_FreeRuntime(rt);
  }
  return (JSRuntime *)0x0;
}

Assistant:

JSRuntime *JS_NewRuntime2(const JSMallocFunctions *mf, void *opaque)
{
    JSRuntime *rt;
    JSMallocState ms;

    memset(&ms, 0, sizeof(ms));
    ms.opaque = opaque;
    ms.malloc_limit = -1;

    rt = mf->js_malloc(&ms, sizeof(JSRuntime));
    if (!rt)
        return NULL;
    memset(rt, 0, sizeof(*rt));
    rt->mf = *mf;
    if (!rt->mf.js_malloc_usable_size) {
        /* use dummy function if none provided */
        rt->mf.js_malloc_usable_size = js_malloc_usable_size_unknown;
    }
    rt->malloc_state = ms;
    rt->malloc_gc_threshold = 256 * 1024;

#ifdef CONFIG_BIGNUM
    bf_context_init(&rt->bf_ctx, js_bf_realloc, rt);
    set_dummy_numeric_ops(&rt->bigint_ops);
    set_dummy_numeric_ops(&rt->bigfloat_ops);
    set_dummy_numeric_ops(&rt->bigdecimal_ops);
#endif

    init_list_head(&rt->context_list);
    init_list_head(&rt->gc_obj_list);
    init_list_head(&rt->gc_zero_ref_count_list);
    rt->gc_phase = JS_GC_PHASE_NONE;
    
#ifdef DUMP_LEAKS
    init_list_head(&rt->string_list);
#endif
    init_list_head(&rt->job_list);

    if (JS_InitAtoms(rt))
        goto fail;

    /* create the object, array and function classes */
    if (init_class_range(rt, js_std_class_def, JS_CLASS_OBJECT,
                         countof(js_std_class_def)) < 0)
        goto fail;
    rt->class_array[JS_CLASS_ARGUMENTS].exotic = &js_arguments_exotic_methods;
    rt->class_array[JS_CLASS_STRING].exotic = &js_string_exotic_methods;
    rt->class_array[JS_CLASS_MODULE_NS].exotic = &js_module_ns_exotic_methods;

    rt->class_array[JS_CLASS_C_FUNCTION].call = js_call_c_function;
    rt->class_array[JS_CLASS_C_FUNCTION_DATA].call = js_c_function_data_call;
    rt->class_array[JS_CLASS_BOUND_FUNCTION].call = js_call_bound_function;
    rt->class_array[JS_CLASS_GENERATOR_FUNCTION].call = js_generator_function_call;
    if (init_shape_hash(rt))
        goto fail;

    rt->stack_size = JS_DEFAULT_STACK_SIZE;
    JS_UpdateStackTop(rt);

    rt->current_exception = JS_NULL;

    return rt;
 fail:
    JS_FreeRuntime(rt);
    return NULL;
}